

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btStridingMeshInterfaceData * __thiscall
btCollisionWorldImporter::createStridingMeshInterfaceData
          (btCollisionWorldImporter *this,btStridingMeshInterfaceData *interfaceData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  btMeshPartData *pbVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  btStridingMeshInterfaceData *pbVar8;
  ulong uVar9;
  btMeshPartData *pbVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  btShortIntIndexData **ppbVar17;
  int local_40;
  btStridingMeshInterfaceData *newData;
  
  pbVar8 = (btStridingMeshInterfaceData *)::operator_new(0x20);
  uVar7 = *(undefined8 *)((interfaceData->m_scaling).m_floats + 2);
  *(undefined8 *)(pbVar8->m_scaling).m_floats = *(undefined8 *)(interfaceData->m_scaling).m_floats;
  *(undefined8 *)((pbVar8->m_scaling).m_floats + 2) = uVar7;
  iVar1 = interfaceData->m_numMeshParts;
  pbVar8->m_numMeshParts = iVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)iVar1;
  uVar9 = SUB168(auVar6 * ZEXT816(0x38),0);
  if (SUB168(auVar6 * ZEXT816(0x38),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  newData = pbVar8;
  pbVar10 = (btMeshPartData *)operator_new__(uVar9);
  pbVar8->m_meshPartsPtr = pbVar10;
  lVar12 = 0x28;
  lVar16 = 0;
  do {
    if (iVar1 <= lVar16) {
      btAlignedObjectArray<btStridingMeshInterfaceData_*>::push_back
                (&this->m_allocatedbtStridingMeshInterfaceDatas,&newData);
      return newData;
    }
    pbVar4 = interfaceData->m_meshPartsPtr;
    iVar2 = *(int *)((long)&pbVar4->m_vertices3d + lVar12);
    lVar13 = (long)iVar2;
    *(int *)((long)&pbVar10->m_vertices3d + lVar12) = iVar2;
    iVar3 = *(int *)((long)&pbVar4->m_vertices3d + lVar12 + 4);
    *(int *)((long)&pbVar10->m_vertices3d + lVar12 + 4) = iVar3;
    if (*(long *)((long)pbVar4 + lVar12 + -0x28) == 0) {
      *(undefined8 *)((long)pbVar10 + lVar12 + -0x28) = 0;
    }
    else {
      sVar15 = (long)iVar3 << 4;
      sVar14 = sVar15;
      if (iVar3 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pbVar10 + lVar12 + -0x28) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pbVar4 + lVar12 + -0x28),sVar15);
    }
    if (*(long *)((long)pbVar4 + lVar12 + -0x20) == 0) {
      *(undefined8 *)((long)pbVar10 + lVar12 + -0x20) = 0;
    }
    else {
      sVar15 = (long)iVar3 << 5;
      sVar14 = sVar15;
      if (iVar3 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pbVar10 + lVar12 + -0x20) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pbVar4 + lVar12 + -0x20),sVar15);
    }
    local_40 = iVar2 * 3;
    lVar5 = *(long *)((long)pbVar4 + lVar12 + -0x18);
    if (lVar5 == 0) {
      *(undefined8 *)((long)pbVar10 + lVar12 + -0x18) = 0;
    }
    else {
      sVar14 = lVar13 * 0xc;
      if (iVar2 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pbVar10 + lVar12 + -0x18) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pbVar4 + lVar12 + -0x18),lVar13 * 0xc);
    }
    if (*(long *)((long)pbVar4 + lVar12 + -0x10) == 0) {
      *(undefined8 *)((long)pbVar10 + lVar12 + -0x10) = 0;
      if (*(long *)((long)&pbVar4->m_vertices3f + lVar12) != 0) {
        ppbVar17 = &pbVar4[lVar16].m_indices16;
        goto LAB_0013eba6;
      }
      *(undefined8 *)((long)&pbVar10->m_vertices3f + lVar12) = 0;
      if ((lVar5 != 0) || (*(long *)((long)pbVar4 + lVar12 + -8) == 0)) goto LAB_0013ebef;
      sVar14 = lVar13 << 2;
      if (iVar2 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pbVar10 + lVar12 + -8) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pbVar4 + lVar12 + -8),lVar13 << 2);
    }
    else {
      sVar14 = lVar13 * 8;
      if (iVar2 < 0) {
        sVar14 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(sVar14);
      *(void **)((long)pbVar10 + lVar12 + -0x10) = pvVar11;
      memcpy(pvVar11,*(void **)((long)pbVar4 + lVar12 + -0x10),lVar13 * 8);
      if (*(long *)((long)&pbVar4->m_vertices3f + lVar12) == 0) {
        *(undefined8 *)((long)&pbVar10->m_vertices3f + lVar12) = 0;
      }
      else {
        ppbVar17 = (btShortIntIndexData **)((long)&pbVar4->m_vertices3f + lVar12);
LAB_0013eba6:
        sVar14 = (long)local_40 << 2;
        if (iVar2 < 0) {
          sVar14 = 0xffffffffffffffff;
        }
        pvVar11 = operator_new__(sVar14);
        *(void **)((long)&pbVar10->m_vertices3f + lVar12) = pvVar11;
        memcpy(pvVar11,*ppbVar17,(long)local_40 << 2);
      }
LAB_0013ebef:
      *(undefined8 *)((long)pbVar10 + lVar12 + -8) = 0;
    }
    lVar16 = lVar16 + 1;
    lVar12 = lVar12 + 0x38;
  } while( true );
}

Assistant:

btStridingMeshInterfaceData* btCollisionWorldImporter::createStridingMeshInterfaceData(btStridingMeshInterfaceData* interfaceData)
{
	//create a new btStridingMeshInterfaceData that is an exact copy of shapedata and store it in the WorldImporter
	btStridingMeshInterfaceData* newData = new btStridingMeshInterfaceData;

	newData->m_scaling = interfaceData->m_scaling;
	newData->m_numMeshParts = interfaceData->m_numMeshParts;
	newData->m_meshPartsPtr = new btMeshPartData[newData->m_numMeshParts];

	for(int i = 0;i < newData->m_numMeshParts;i++)
	{
		btMeshPartData* curPart = &interfaceData->m_meshPartsPtr[i];
		btMeshPartData* curNewPart = &newData->m_meshPartsPtr[i];

		curNewPart->m_numTriangles = curPart->m_numTriangles;
		curNewPart->m_numVertices = curPart->m_numVertices;

		if(curPart->m_vertices3f)
		{
			curNewPart->m_vertices3f = new btVector3FloatData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3f,curPart->m_vertices3f,sizeof(btVector3FloatData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3f = NULL;

		if(curPart->m_vertices3d)
		{
			curNewPart->m_vertices3d = new btVector3DoubleData[curNewPart->m_numVertices];
			memcpy(curNewPart->m_vertices3d,curPart->m_vertices3d,sizeof(btVector3DoubleData) * curNewPart->m_numVertices);
		}
		else
			curNewPart->m_vertices3d = NULL;

		int numIndices = curNewPart->m_numTriangles * 3;
		///the m_3indices8 was not initialized in some Bullet versions, this can cause crashes at loading time
		///we catch it by only dealing with m_3indices8 if none of the other indices are initialized
		bool uninitialized3indices8Workaround =false;

		if(curPart->m_indices32)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_indices32 = new btIntIndexData[numIndices];
			memcpy(curNewPart->m_indices32,curPart->m_indices32,sizeof(btIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices32 = NULL;

		if(curPart->m_3indices16)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_3indices16 = new btShortIntIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices16,curPart->m_3indices16,sizeof(btShortIntIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices16 = NULL;

		if(curPart->m_indices16)
		{
			uninitialized3indices8Workaround=true;
			curNewPart->m_indices16 = new btShortIntIndexData[numIndices];
			memcpy(curNewPart->m_indices16,curPart->m_indices16,sizeof(btShortIntIndexData) * numIndices);
		}
		else
			curNewPart->m_indices16 = NULL;

		if(!uninitialized3indices8Workaround && curPart->m_3indices8)
		{
			curNewPart->m_3indices8 = new btCharIndexTripletData[curNewPart->m_numTriangles];
			memcpy(curNewPart->m_3indices8,curPart->m_3indices8,sizeof(btCharIndexTripletData) * curNewPart->m_numTriangles);
		}
		else
			curNewPart->m_3indices8 = NULL;

	}

	m_allocatedbtStridingMeshInterfaceDatas.push_back(newData);

	return(newData);
}